

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.c
# Opt level: O3

int lws_finalize_write_http_header(lws *wsi,uchar *start,uchar **pp,uchar *end)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  
  if ((wsi->role_ops != &role_ops_h2) && ((wsi->wsistate & 0xf000000) != 0x1000000)) {
    puVar1 = *pp;
    if ((long)end - (long)puVar1 < 3) {
      return 1;
    }
    *pp = puVar1 + 1;
    *puVar1 = '\r';
    puVar1 = *pp;
    *pp = puVar1 + 1;
    *puVar1 = '\n';
  }
  iVar2 = (int)*pp - (int)start;
  iVar3 = lws_write(wsi,start,(long)iVar2,LWS_WRITE_HTTP_HEADERS);
  return (uint)(iVar3 != iVar2);
}

Assistant:

int lws_finalize_http_header(struct lws *wsi, unsigned char **p,
			     unsigned char *end)
{
#ifdef LWS_WITH_HTTP2
	if (lwsi_role_h2(wsi) || lwsi_role_h2_ENCAPSULATION(wsi))
		return 0;
#else
	(void)wsi;
#endif
	if ((lws_intptr_t)(end - *p) < 3)
		return 1;
	*((*p)++) = '\x0d';
	*((*p)++) = '\x0a';

	return 0;
}